

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  string *name;
  long lVar4;
  string_view value;
  string_view value_00;
  char nMatches [2];
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  cmStateSnapshot *local_38;
  
  local_38 = &this->StateSnapshot;
  lVar4 = -10;
  name = matchVariables_abi_cxx11_;
  iVar3 = 0;
  do {
    pcVar1 = (re->regmatch).endp[lVar4];
    local_58 = &local_48;
    if (pcVar1 == (char *)0x0) {
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar1,(re->regmatch).endp[lVar4 + 10]);
    }
    if (local_50 != 0) {
      value._M_str = local_58;
      value._M_len = local_50;
      AddDefinition(this,name,value);
      cmStateSnapshot::GetDefinition(local_38,name);
      iVar3 = (int)lVar4 + 0x3a;
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    name = name + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  local_58._0_2_ = (ushort)(byte)iVar3;
  sVar2 = strlen((char *)&local_58);
  value_00._M_str = (char *)&local_58;
  value_00._M_len = sVar2;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,value_00);
  cmStateSnapshot::GetDefinition(local_38,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m);
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}